

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.hpp
# Opt level: O0

ssize_t __thiscall
boost::deflate::detail::window::read(window *this,int __fd,void *__buf,size_t __nbytes)

{
  type puVar1;
  void *pvVar2;
  ulong __n;
  ulong __i;
  undefined4 in_register_00000034;
  size_t m;
  size_t i;
  size_t n_local;
  size_t pos_local;
  uint8_t *out_local;
  window *this_local;
  
  pvVar2 = (void *)CONCAT44(in_register_00000034,__fd);
  if (this->i_ < this->size_) {
    __i = (((ulong)this->i_ - (long)__buf) + (ulong)this->capacity_) % (ulong)this->capacity_;
    __n = this->capacity_ - __i;
    if (__n < __nbytes) {
      puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&this->p_,__i);
      memcpy(pvVar2,puVar1,__n);
      puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&this->p_,0);
      pvVar2 = memcpy((void *)(__n + (long)pvVar2),puVar1,__nbytes - __n);
    }
    else {
      puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&this->p_,__i);
      pvVar2 = memcpy(pvVar2,puVar1,__nbytes);
    }
  }
  else {
    puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       (&this->p_,(ulong)this->i_ - (long)__buf);
    pvVar2 = memcpy(pvVar2,puVar1,__nbytes);
  }
  return (ssize_t)pvVar2;
}

Assistant:

void
    read(std::uint8_t* out, std::size_t pos, std::size_t n)
    {
        if(i_ >= size_)
        {
            // window is contiguous
            std::memcpy(out, &p_[i_ - pos], n);
            return;
        }
        auto i = ((i_ - pos) + capacity_) % capacity_;
        auto m = capacity_ - i;
        if(n <= m)
        {
            std::memcpy(out, &p_[i], n);
            return;
        }
        std::memcpy(out, &p_[i], m);
        out += m;
        std::memcpy(out, &p_[0], n - m);
    }